

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_objects::load(xr_scene_objects *this,xr_reader *r)

{
  uint32_t uVar1;
  xr_scene_revision *this_00;
  size_t sVar2;
  xr_scene *this_01;
  size_type sVar3;
  size_t num_objects;
  xr_reader *r_local;
  xr_scene_objects *this_local;
  
  this_00 = xr_scene_part::revision(&this->super_xr_scene_part);
  xr_scene_revision::load(this_00,r);
  sVar2 = xr_reader::find_chunk(r,2);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                  ,0x6d,"virtual void xray_re::xr_scene_objects::load(xr_reader &)");
  }
  uVar1 = xr_reader::r_u32(r);
  xr_reader::debug_find_chunk(r);
  this_01 = xr_scene_part::scene(&this->super_xr_scene_part);
  xr_scene::load_objects(this_01,r,3,&this->m_objects);
  sVar3 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
          size(&this->m_objects);
  if (uVar1 == sVar3) {
    return;
  }
  __assert_fail("num_objects == m_objects.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                ,0x72,"virtual void xray_re::xr_scene_objects::load(xr_reader &)");
}

Assistant:

void xr_scene_objects::load(xr_reader& r)
{
	revision().load(r);
	if (!r.find_chunk(TOOLS_CHUNK_COUNT))
		xr_not_expected();
	size_t num_objects = r.r_u32();
	r.debug_find_chunk();

	scene().load_objects(r, TOOLS_CHUNK_OBJECTS, m_objects);
	xr_assert(num_objects == m_objects.size());
}